

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O1

RPCHelpMan * validateaddress(void)

{
  ulong *puVar1;
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_11;
  RPCArgOptions opts;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined8 uVar13;
  RPCHelpMan *in_RDI;
  long lVar14;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff208;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffff20c;
  undefined8 in_stack_fffffffffffff218;
  undefined8 in_stack_fffffffffffff220;
  undefined8 in_stack_fffffffffffff228;
  code *pcVar16;
  undefined8 in_stack_fffffffffffff230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff238;
  pointer in_stack_fffffffffffff248;
  pointer pRVar17;
  pointer in_stack_fffffffffffff250;
  pointer pRVar18;
  pointer in_stack_fffffffffffff258;
  pointer pRVar19;
  _Vector_impl_data in_stack_fffffffffffff260;
  pointer in_stack_fffffffffffff278;
  pointer pRVar20;
  pointer in_stack_fffffffffffff280;
  pointer pRVar21;
  pointer in_stack_fffffffffffff288;
  pointer pRVar22;
  undefined8 in_stack_fffffffffffff290;
  pointer in_stack_fffffffffffff298;
  pointer in_stack_fffffffffffff2a0;
  pointer in_stack_fffffffffffff2a8;
  undefined8 in_stack_fffffffffffff2b0;
  pointer in_stack_fffffffffffff2b8;
  pointer in_stack_fffffffffffff2c0;
  pointer in_stack_fffffffffffff2c8;
  undefined8 in_stack_fffffffffffff2d0;
  pointer in_stack_fffffffffffff2d8;
  pointer in_stack_fffffffffffff2e0;
  pointer in_stack_fffffffffffff2e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_d08;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ce8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_cc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ca8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c90;
  RPCResults local_c78;
  allocator_type local_c59;
  vector<RPCArg,_std::allocator<RPCArg>_> local_c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c40;
  string local_c20;
  string local_c00;
  string local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  ulong *local_b40;
  undefined8 local_b38;
  ulong local_b30;
  undefined8 uStack_b28;
  ulong *local_b20;
  size_type local_b18;
  ulong local_b10;
  undefined8 uStack_b08;
  long *local_b00 [2];
  long local_af0 [2];
  long *local_ae0 [2];
  long local_ad0 [2];
  RPCResult local_ac0;
  long *local_a38 [2];
  long local_a28 [2];
  long *local_a18 [2];
  long local_a08 [2];
  long *local_9f8 [2];
  long local_9e8 [2];
  long *local_9d8 [2];
  long local_9c8 [2];
  long *local_9b8 [2];
  long local_9a8 [2];
  long *local_998 [2];
  long local_988 [2];
  long *local_978 [2];
  long local_968 [2];
  long *local_958 [2];
  long local_948 [2];
  long *local_938 [2];
  long local_928 [2];
  long *local_918 [2];
  long local_908 [2];
  long *local_8f8 [2];
  long local_8e8 [2];
  long *local_8d8 [2];
  long local_8c8 [2];
  long *local_8b8 [2];
  long local_8a8 [2];
  long *local_898 [2];
  long local_888 [2];
  long *local_878 [2];
  long local_868 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_858;
  long *local_838 [2];
  long local_828 [2];
  pointer local_818 [2];
  undefined1 local_808 [152];
  RPCResult local_770;
  RPCResult local_6e8;
  RPCResult local_660;
  RPCResult local_5d8;
  RPCResult local_550;
  RPCResult local_4c8;
  RPCResult local_440;
  RPCResult local_3b8;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  RPCResult local_2f0;
  undefined1 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 local_240 [32];
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"validateaddress","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nReturn information about the given bitcoin address.\n","");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"address","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"The bitcoin address to validate","");
  local_268 = 0;
  local_258 = 0;
  local_250 = 0;
  local_240._0_8_ = (pointer)0x0;
  local_240._8_2_ = 0;
  local_240._10_6_ = 0;
  local_240._16_2_ = 0;
  local_240._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff20c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff208;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff218;
  name.field_2._8_8_ = in_stack_fffffffffffff220;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff230;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff228;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff238;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff248;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff250;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff258;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff260._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff260._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff260._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff278;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff280;
  description_11._M_string_length = in_stack_fffffffffffff290;
  description_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffff288;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff298;
  description_11.field_2._8_8_ = in_stack_fffffffffffff2a0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2b0;
  opts._0_8_ = in_stack_fffffffffffff2a8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff2b8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff2c0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff2c8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff2d0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff2d8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff2e0;
  opts._64_8_ = in_stack_fffffffffffff2e8;
  local_260 = &local_250;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_11,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_c58,__l,&local_c59);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
  local_818[0] = (pointer)local_808;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"isvalid","");
  local_838[0] = local_828;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_838,"If the address is valid or not","");
  local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff20c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff208;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff218;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff220;
  description._M_string_length = in_stack_fffffffffffff230;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description.field_2 = in_stack_fffffffffffff238;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff250;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff248;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff258;
  RPCResult::RPCResult
            ((RPCResult *)(local_808 + 0x10),BOOL,m_key_name,description,inner,SUB81(local_818,0));
  local_858.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_858.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"address","");
  local_878[0] = local_868;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_878,"The bitcoin address validated","");
  local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_8_ = in_RDI;
  auVar2._0_4_ = in_stack_fffffffffffff20c;
  auVar2._12_8_ = in_stack_fffffffffffff218;
  auVar2._20_8_ = in_stack_fffffffffffff220;
  auVar2._28_4_ = 0;
  description_00._M_string_length = in_stack_fffffffffffff230;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_00.field_2 = in_stack_fffffffffffff238;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff250;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff248;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff258;
  RPCResult::RPCResult
            (&local_770,STR,(string)(auVar2 << 0x20),SUB81(&local_858,0),description_00,inner_00,
             true);
  local_898[0] = local_888;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_898,"scriptPubKey","");
  local_8b8[0] = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8b8,"The hex-encoded output script generated by the address","");
  local_ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_fffffffffffff20c;
  auVar3._12_8_ = in_stack_fffffffffffff218;
  auVar3._20_8_ = in_stack_fffffffffffff220;
  auVar3._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff230;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_01.field_2 = in_stack_fffffffffffff238;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff250;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff248;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff258;
  RPCResult::RPCResult
            (&local_6e8,STR_HEX,(string)(auVar3 << 0x20),SUB81(local_898,0),description_01,inner_01,
             true);
  local_8d8[0] = local_8c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d8,"isscript","");
  local_8f8[0] = local_8e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"If the key is a script","");
  local_d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_fffffffffffff20c;
  auVar4._12_8_ = in_stack_fffffffffffff218;
  auVar4._20_8_ = in_stack_fffffffffffff220;
  auVar4._28_4_ = 0;
  description_02._M_string_length = in_stack_fffffffffffff230;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_02.field_2 = in_stack_fffffffffffff238;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff250;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff248;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff258;
  RPCResult::RPCResult
            (&local_660,BOOL,(string)(auVar4 << 0x20),SUB81(local_8d8,0),description_02,inner_02,
             true);
  local_918[0] = local_908;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_918,"iswitness","");
  local_938[0] = local_928;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_938,"If the address is a witness address","");
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = in_stack_fffffffffffff20c;
  auVar5._12_8_ = in_stack_fffffffffffff218;
  auVar5._20_8_ = in_stack_fffffffffffff220;
  auVar5._28_4_ = 0;
  description_03._M_string_length = in_stack_fffffffffffff230;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_03.field_2 = in_stack_fffffffffffff238;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff250;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff248;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff258;
  RPCResult::RPCResult
            (&local_5d8,BOOL,(string)(auVar5 << 0x20),SUB81(local_918,0),description_03,inner_03,
             true);
  local_958[0] = local_948;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_958,"witness_version","");
  local_978[0] = local_968;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_978,"The version number of the witness program","");
  auVar6._4_8_ = in_RDI;
  auVar6._0_4_ = in_stack_fffffffffffff20c;
  auVar6._12_8_ = in_stack_fffffffffffff218;
  auVar6._20_8_ = in_stack_fffffffffffff220;
  auVar6._28_4_ = 0;
  description_04._M_string_length = in_stack_fffffffffffff230;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_04.field_2 = in_stack_fffffffffffff238;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff250;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff248;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff258;
  RPCResult::RPCResult
            (&local_550,NUM,(string)(auVar6 << 0x20),SUB81(local_958,0),description_04,inner_04,true
            );
  local_998[0] = local_988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"witness_program","");
  local_9b8[0] = local_9a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9b8,"The hex value of the witness program","");
  auVar7._4_8_ = in_RDI;
  auVar7._0_4_ = in_stack_fffffffffffff20c;
  auVar7._12_8_ = in_stack_fffffffffffff218;
  auVar7._20_8_ = in_stack_fffffffffffff220;
  auVar7._28_4_ = 0;
  description_05._M_string_length = in_stack_fffffffffffff230;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_05.field_2 = in_stack_fffffffffffff238;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff250;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff248;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff258;
  RPCResult::RPCResult
            (&local_4c8,STR_HEX,(string)(auVar7 << 0x20),SUB81(local_998,0),description_05,inner_05,
             true);
  local_9d8[0] = local_9c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"error","");
  local_9f8[0] = local_9e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"Error message, if any","");
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  pRVar22 = (pointer)0x0;
  uVar15 = 0;
  auVar8._4_8_ = in_RDI;
  auVar8._0_4_ = in_stack_fffffffffffff20c;
  auVar8._12_8_ = in_stack_fffffffffffff218;
  auVar8._20_8_ = in_stack_fffffffffffff220;
  auVar8._28_4_ = 0;
  description_06._M_string_length = in_stack_fffffffffffff230;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_06.field_2 = in_stack_fffffffffffff238;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff250;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff248;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff258;
  RPCResult::RPCResult
            (&local_440,STR,(string)(auVar8 << 0x20),SUB81(local_9d8,0),description_06,inner_06,true
            );
  local_a18[0] = local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"error_locations","");
  local_a38[0] = local_a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,
             "Indices of likely error locations in address, if known (e.g. Bech32 errors)","");
  local_ae0[0] = local_ad0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"index","");
  local_b00[0] = local_af0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b00,"index of a potential error","");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff20c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar15;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff218;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff220;
  description_07._M_string_length = in_stack_fffffffffffff230;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_07.field_2 = in_stack_fffffffffffff238;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_ac0,NUM,m_key_name_00,description_07,inner_07,SUB81(local_ae0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_ac0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff260,__l_00,
             (allocator_type *)&stack0xfffffffffffff247);
  uVar15 = 0;
  auVar9._4_8_ = in_RDI;
  auVar9._0_4_ = in_stack_fffffffffffff20c;
  auVar9._12_8_ = in_stack_fffffffffffff218;
  auVar9._20_8_ = in_stack_fffffffffffff220;
  auVar9._28_4_ = 0;
  description_08._M_string_length = in_stack_fffffffffffff230;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_08.field_2._M_local_buf = in_stack_fffffffffffff238._M_local_buf;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar18;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar17;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar19;
  RPCResult::RPCResult
            (&local_3b8,ARR,(string)(auVar9 << 0x20),SUB81(local_a18,0),description_08,inner_08,true
            );
  __l_01._M_len = 9;
  __l_01._M_array = (iterator)(local_808 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_c90,__l_01,(allocator_type *)&stack0xfffffffffffff246);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff20c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar15;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff218;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff220;
  description_09._M_string_length = in_stack_fffffffffffff230;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff228;
  description_09.field_2 = in_stack_fffffffffffff238;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar18;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar17;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar19;
  RPCResult::RPCResult(&local_2f0,OBJ,m_key_name_01,description_09,inner_09,SUB81(local_310,0));
  result._4_4_ = in_stack_fffffffffffff20c;
  result.m_type = uVar15;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff218;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff220;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff228;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff230;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff238;
  result._64_8_ = pRVar17;
  result.m_description._M_dataplus._M_p = (pointer)pRVar18;
  result.m_description._M_string_length = (size_type)pRVar19;
  result._88_24_ = in_stack_fffffffffffff260;
  result.m_cond._M_string_length = (size_type)pRVar20;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar21;
  result.m_cond.field_2._8_8_ = pRVar22;
  RPCResults::RPCResults(&local_c78,result);
  local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"validateaddress","");
  std::operator+(&local_bc0,"\"",EXAMPLE_ADDRESS_abi_cxx11_);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_bc0,"\"");
  local_ba0._M_dataplus._M_p = (pointer)&local_ba0.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar10->_M_dataplus)._M_p;
  paVar11 = &pbVar10->field_2;
  if (paVar12 == paVar11) {
    local_ba0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_ba0.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
  }
  else {
    local_ba0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_ba0._M_dataplus._M_p = (pointer)paVar12;
  }
  local_ba0._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  HelpExampleCli(&local_b60,&local_b80,&local_ba0);
  local_c00._M_dataplus._M_p = (pointer)&local_c00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c00,"validateaddress","");
  std::operator+(&local_c40,"\"",EXAMPLE_ADDRESS_abi_cxx11_);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_c40,"\"");
  local_c20._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_dataplus._M_p == paVar12) {
    local_c20.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_c20.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
    local_c20._M_dataplus._M_p = (pointer)&local_c20.field_2;
  }
  else {
    local_c20.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_c20._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  HelpExampleRpc(&local_be0,&local_c00,&local_c20);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
    uVar13 = local_b60.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_be0._M_string_length + local_b60._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_be0._M_dataplus._M_p != &local_be0.field_2) {
      uVar13 = local_be0.field_2._M_allocated_capacity;
    }
    if (local_be0._M_string_length + local_b60._M_string_length <= (ulong)uVar13) {
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_be0,0,0,local_b60._M_dataplus._M_p,local_b60._M_string_length);
      goto LAB_0036a10c;
    }
  }
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_b60,local_be0._M_dataplus._M_p,local_be0._M_string_length);
LAB_0036a10c:
  local_b40 = &local_b30;
  puVar1 = (ulong *)(pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 == paVar12) {
    local_b30 = paVar12->_M_allocated_capacity;
    uStack_b28 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
  }
  else {
    local_b30 = paVar12->_M_allocated_capacity;
    local_b40 = puVar1;
  }
  local_b18 = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  paVar12->_M_local_buf[0] = '\0';
  if (local_b40 == &local_b30) {
    uStack_b08 = uStack_b28;
    local_b20 = &local_b10;
  }
  else {
    local_b20 = local_b40;
  }
  local_b10 = local_b30;
  local_b38 = 0;
  local_b30 = local_b30 & 0xffffffffffffff00;
  pcVar16 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:57:9)>
            ::_M_manager;
  description_10._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:57:9)>
       ::_M_invoke;
  description_10._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:57:9)>
                ::_M_manager;
  description_10.field_2 = in_stack_fffffffffffff238;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar18;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar17;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar19;
  examples.m_examples._M_string_length = (size_type)pRVar21;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar20;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar22;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff290;
  local_b40 = &local_b30;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff218)),description_10,args,
             (RPCResults)in_stack_fffffffffffff260,examples,(RPCMethodImpl *)&local_58);
  if (pcVar16 != (code *)0x0) {
    (*pcVar16)(&stack0xfffffffffffff218,&stack0xfffffffffffff218,3);
  }
  if (local_b20 != &local_b10) {
    operator_delete(local_b20,local_b10 + 1);
  }
  if (local_b40 != &local_b30) {
    operator_delete(local_b40,local_b30 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be0._M_dataplus._M_p != &local_be0.field_2) {
    operator_delete(local_be0._M_dataplus._M_p,local_be0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
    operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c40._M_dataplus._M_p != &local_c40.field_2) {
    operator_delete(local_c40._M_dataplus._M_p,local_c40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c00._M_dataplus._M_p != &local_c00.field_2) {
    operator_delete(local_c00._M_dataplus._M_p,local_c00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
    operator_delete(local_b60._M_dataplus._M_p,local_b60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
    operator_delete(local_ba0._M_dataplus._M_p,local_ba0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
    operator_delete(local_bc0._M_dataplus._M_p,local_bc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
    operator_delete(local_b80._M_dataplus._M_p,local_b80.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c78.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_cond._M_dataplus._M_p != &local_2f0.m_cond.field_2) {
    operator_delete(local_2f0.m_cond._M_dataplus._M_p,
                    local_2f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_key_name._M_dataplus._M_p != &local_2f0.m_key_name.field_2) {
    operator_delete(local_2f0.m_key_name._M_dataplus._M_p,
                    local_2f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c90);
  lVar14 = 0x4c8;
  do {
    if ((long *)(local_808 + lVar14) != *(long **)((long)local_818 + lVar14)) {
      operator_delete(*(long **)((long)local_818 + lVar14),*(long *)(local_808 + lVar14) + 1);
    }
    if ((long *)((long)local_828 + lVar14) != *(long **)((long)local_838 + lVar14)) {
      operator_delete(*(long **)((long)local_838 + lVar14),*(long *)((long)local_828 + lVar14) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_858.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar14));
    if ((long *)((long)local_868 + lVar14) != *(long **)((long)local_878 + lVar14)) {
      operator_delete(*(long **)((long)local_878 + lVar14),*(long *)((long)local_868 + lVar14) + 1);
    }
    lVar14 = lVar14 + -0x88;
  } while (lVar14 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.m_cond._M_dataplus._M_p != &local_ac0.m_cond.field_2) {
    operator_delete(local_ac0.m_cond._M_dataplus._M_p,
                    local_ac0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.m_description._M_dataplus._M_p != &local_ac0.m_description.field_2) {
    operator_delete(local_ac0.m_description._M_dataplus._M_p,
                    local_ac0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ac0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.m_key_name._M_dataplus._M_p != &local_ac0.m_key_name.field_2) {
    operator_delete(local_ac0.m_key_name._M_dataplus._M_p,
                    local_ac0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff248);
  if (local_b00[0] != local_af0) {
    operator_delete(local_b00[0],local_af0[0] + 1);
  }
  if (local_ae0[0] != local_ad0) {
    operator_delete(local_ae0[0],local_ad0[0] + 1);
  }
  if (local_a38[0] != local_a28) {
    operator_delete(local_a38[0],local_a28[0] + 1);
  }
  if (local_a18[0] != local_a08) {
    operator_delete(local_a18[0],local_a08[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff278);
  if (local_9f8[0] != local_9e8) {
    operator_delete(local_9f8[0],local_9e8[0] + 1);
  }
  if (local_9d8[0] != local_9c8) {
    operator_delete(local_9d8[0],local_9c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff298);
  if (local_9b8[0] != local_9a8) {
    operator_delete(local_9b8[0],local_9a8[0] + 1);
  }
  if (local_998[0] != local_988) {
    operator_delete(local_998[0],local_988[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2b8);
  if (local_978[0] != local_968) {
    operator_delete(local_978[0],local_968[0] + 1);
  }
  if (local_958[0] != local_948) {
    operator_delete(local_958[0],local_948[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2d8);
  if (local_938[0] != local_928) {
    operator_delete(local_938[0],local_928[0] + 1);
  }
  if (local_918[0] != local_908) {
    operator_delete(local_918[0],local_908[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d08);
  if (local_8f8[0] != local_8e8) {
    operator_delete(local_8f8[0],local_8e8[0] + 1);
  }
  if (local_8d8[0] != local_8c8) {
    operator_delete(local_8d8[0],local_8c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ce8);
  if (local_8b8[0] != local_8a8) {
    operator_delete(local_8b8[0],local_8a8[0] + 1);
  }
  if (local_898[0] != local_888) {
    operator_delete(local_898[0],local_888[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cc8);
  if (local_878[0] != local_868) {
    operator_delete(local_878[0],local_868[0] + 1);
  }
  if (local_858.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_858.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_858.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_858.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ca8);
  if (local_838[0] != local_828) {
    operator_delete(local_838[0],local_828[0] + 1);
  }
  if (local_818[0] != (pointer)local_808) {
    operator_delete(local_818[0],local_808._0_8_ + 1);
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_c58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan validateaddress()
{
    return RPCHelpMan{
        "validateaddress",
        "\nReturn information about the given bitcoin address.\n",
        {
            {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address to validate"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::BOOL, "isvalid", "If the address is valid or not"},
                {RPCResult::Type::STR, "address", /*optional=*/true, "The bitcoin address validated"},
                {RPCResult::Type::STR_HEX, "scriptPubKey", /*optional=*/true, "The hex-encoded output script generated by the address"},
                {RPCResult::Type::BOOL, "isscript", /*optional=*/true, "If the key is a script"},
                {RPCResult::Type::BOOL, "iswitness", /*optional=*/true, "If the address is a witness address"},
                {RPCResult::Type::NUM, "witness_version", /*optional=*/true, "The version number of the witness program"},
                {RPCResult::Type::STR_HEX, "witness_program", /*optional=*/true, "The hex value of the witness program"},
                {RPCResult::Type::STR, "error", /*optional=*/true, "Error message, if any"},
                {RPCResult::Type::ARR, "error_locations", /*optional=*/true, "Indices of likely error locations in address, if known (e.g. Bech32 errors)",
                    {
                        {RPCResult::Type::NUM, "index", "index of a potential error"},
                    }},
            }
        },
        RPCExamples{
            HelpExampleCli("validateaddress", "\"" + EXAMPLE_ADDRESS[0] + "\"") +
            HelpExampleRpc("validateaddress", "\"" + EXAMPLE_ADDRESS[0] + "\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::string error_msg;
            std::vector<int> error_locations;
            CTxDestination dest = DecodeDestination(request.params[0].get_str(), error_msg, &error_locations);
            const bool isValid = IsValidDestination(dest);
            CHECK_NONFATAL(isValid == error_msg.empty());

            UniValue ret(UniValue::VOBJ);
            ret.pushKV("isvalid", isValid);
            if (isValid) {
                std::string currentAddress = EncodeDestination(dest);
                ret.pushKV("address", currentAddress);

                CScript scriptPubKey = GetScriptForDestination(dest);
                ret.pushKV("scriptPubKey", HexStr(scriptPubKey));

                UniValue detail = DescribeAddress(dest);
                ret.pushKVs(std::move(detail));
            } else {
                UniValue error_indices(UniValue::VARR);
                for (int i : error_locations) error_indices.push_back(i);
                ret.pushKV("error_locations", std::move(error_indices));
                ret.pushKV("error", error_msg);
            }

            return ret;
        },
    };
}